

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block.cpp
# Opt level: O2

string * __thiscall CBlock::ToString_abi_cxx11_(string *__return_storage_ptr__,CBlock *this)

{
  pointer psVar1;
  ostream *poVar2;
  shared_ptr<const_CTransaction> *tx;
  pointer psVar3;
  long in_FS_OFFSET;
  unsigned_long *in_stack_fffffffffffffd88;
  long local_268;
  string local_260;
  string local_240;
  uint256 local_220;
  string local_200;
  string local_1e0;
  stringstream s;
  ostream local_1b0 [376];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::stringstream::stringstream((stringstream *)&s);
  CBlockHeader::GetHash(&local_220,&this->super_CBlockHeader);
  base_blob<256u>::ToString_abi_cxx11_(&local_200,(base_blob<256u> *)&local_220);
  base_blob<256u>::ToString_abi_cxx11_
            (&local_240,(base_blob<256u> *)&(this->super_CBlockHeader).hashPrevBlock);
  base_blob<256u>::ToString_abi_cxx11_
            (&local_260,(base_blob<256u> *)&(this->super_CBlockHeader).hashMerkleRoot);
  local_268 = (long)(this->vtx).
                    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->vtx).
                    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4;
  tinyformat::
  format<std::__cxx11::string,int,std::__cxx11::string,std::__cxx11::string,unsigned_int,unsigned_int,unsigned_int,unsigned_long>
            (&local_1e0,
             (tinyformat *)
             "CBlock(hash=%s, ver=0x%08x, hashPrevBlock=%s, hashMerkleRoot=%s, nTime=%u, nBits=%08x, nNonce=%u, vtx=%u)\n"
             ,(char *)&local_200,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
             (int *)&local_240,&local_260,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &(this->super_CBlockHeader).nTime,&(this->super_CBlockHeader).nBits,
             &(this->super_CBlockHeader).nNonce,(uint *)&local_268,in_stack_fffffffffffffd88);
  std::operator<<(local_1b0,(string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_260);
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::string::~string((string *)&local_200);
  psVar1 = (this->vtx).
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar3 = (this->vtx).
                super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar3 != psVar1; psVar3 = psVar3 + 1) {
    poVar2 = std::operator<<(local_1b0,"  ");
    CTransaction::ToString_abi_cxx11_
              (&local_1e0,
               (psVar3->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
    poVar2 = std::operator<<(poVar2,(string *)&local_1e0);
    std::operator<<(poVar2,"\n");
    std::__cxx11::string::~string((string *)&local_1e0);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&s);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string CBlock::ToString() const
{
    std::stringstream s;
    s << strprintf("CBlock(hash=%s, ver=0x%08x, hashPrevBlock=%s, hashMerkleRoot=%s, nTime=%u, nBits=%08x, nNonce=%u, vtx=%u)\n",
        GetHash().ToString(),
        nVersion,
        hashPrevBlock.ToString(),
        hashMerkleRoot.ToString(),
        nTime, nBits, nNonce,
        vtx.size());
    for (const auto& tx : vtx) {
        s << "  " << tx->ToString() << "\n";
    }
    return s.str();
}